

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char>_>
fmt::v8::detail::copy_str<char,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char>>>
          (char *begin,char *end,back_insert_iterator<fmt::v8::detail::buffer<char>_> out)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (begin != end) {
    do {
      cVar1 = *begin;
      sVar2 = (out.container)->size_;
      uVar3 = sVar2 + 1;
      if ((out.container)->capacity_ < uVar3) {
        (**(out.container)->_vptr_buffer)(out.container);
        sVar2 = (out.container)->size_;
        uVar3 = sVar2 + 1;
      }
      begin = begin + 1;
      (out.container)->size_ = uVar3;
      (out.container)->ptr_[sVar2] = cVar1;
    } while (begin != end);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)out.container;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}